

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::StringOutputStream::Next(StringOutputStream *this,void **data,int *size)

{
  string *psVar1;
  ulong uVar2;
  undefined1 uVar3;
  int iVar4;
  ulong uVar5;
  StringOutputStream *pSVar6;
  StringOutputStream *extraout_RAX;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  long *plVar11;
  undefined1 auStack_1090 [4096];
  long alStack_60 [3];
  StringOutputStream SStack_48;
  StringOutputStream local_30;
  
  psVar1 = this->target_;
  if (psVar1 != (string *)0x0) {
    uVar2 = psVar1->_M_string_length;
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(psVar1->_M_dataplus)._M_p != &psVar1->field_2) {
      uVar5 = (psVar1->field_2)._M_allocated_capacity;
    }
    uVar8 = uVar2 * 2;
    if (uVar2 < uVar5) {
      uVar8 = uVar5;
    }
    if (uVar2 + 0x7fffffff < uVar8) {
      uVar8 = uVar2 + 0x7fffffff;
    }
    uVar5 = 0x10;
    if (0x10 < uVar8) {
      uVar5 = uVar8;
    }
    SStack_48.target_ = (string *)0x2b504d;
    std::__cxx11::string::resize((ulong)psVar1,(char)uVar5);
    *data = (this->target_->_M_dataplus)._M_p + uVar2;
    *size = (int)this->target_->_M_string_length - (int)uVar2;
    return true;
  }
  pSVar6 = &local_30;
  SStack_48.target_ = (string *)BackUp;
  Next(pSVar6);
  if ((int)data < 0) {
    data = (void **)&SStack_48;
    alStack_60[1] = 0x2b50ba;
    BackUp();
  }
  else {
    psVar1 = pSVar6->target_;
    if (psVar1 != (string *)0x0) {
      pSVar6 = (StringOutputStream *)((ulong)data & 0xffffffff);
      data = (void **)psVar1->_M_string_length;
      if (pSVar6 <= data) {
        uVar3 = std::__cxx11::string::resize((ulong)psVar1,(char)data - (char)pSVar6);
        return (bool)uVar3;
      }
      goto LAB_002b50c4;
    }
  }
  alStack_60[1] = 0x2b50c4;
  BackUp(&SStack_48);
  pSVar6 = extraout_RAX;
LAB_002b50c4:
  iVar10 = (int)data;
  alStack_60[1] = 0x2b50d1;
  BackUp();
  if (pSVar6->target_ != (string *)0x0) {
    return SUB81(pSVar6->target_->_M_string_length,0);
  }
  plVar11 = alStack_60;
  ByteCount();
  iVar9 = 0;
  do {
    iVar7 = iVar9;
    iVar9 = iVar10 - iVar7;
    if (iVar9 == 0 || iVar10 < iVar7) break;
    if (0xfff < iVar9) {
      iVar9 = 0x1000;
    }
    iVar4 = (**(code **)(*plVar11 + 0x10))(plVar11,auStack_1090,iVar9);
    iVar9 = iVar4 + iVar7;
  } while (0 < iVar4);
  return SUB41(iVar7,0);
}

Assistant:

bool StringOutputStream::Next(void** data, int* size) {
  ABSL_CHECK(target_ != nullptr);
  size_t old_size = target_->size();

  // Grow the string.
  size_t new_size;
  if (old_size < target_->capacity()) {
    // Resize the string to match its capacity, since we can get away
    // without a memory allocation this way.
    new_size = target_->capacity();
  } else {
    // Size has reached capacity, try to double it.
    new_size = old_size * 2;
  }
  // Avoid integer overflow in returned '*size'.
  new_size = std::min(new_size, old_size + std::numeric_limits<int>::max());
  // Increase the size, also make sure that it is at least kMinimumSize.
  absl::strings_internal::STLStringResizeUninitialized(
      target_,
      std::max(new_size,
               kMinimumSize + 0));  // "+ 0" works around GCC4 weirdness.

  *data = mutable_string_data(target_) + old_size;
  *size = target_->size() - old_size;
  return true;
}